

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

bool spvOpcodeIsReturnOrAbort(Op opcode)

{
  bool bVar1;
  
  if (opcode - OpReturn < 2) {
    return true;
  }
  bVar1 = spvOpcodeIsAbort(opcode);
  return bVar1;
}

Assistant:

bool spvOpcodeIsReturn(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpReturn:
    case spv::Op::OpReturnValue:
      return true;
    default:
      return false;
  }
}